

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

DdNode * cuddUniqueInter(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  void *pvVar4;
  DdSubtable *pDVar5;
  int *piVar6;
  bool bVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  DdNode **ppDVar11;
  DdNode *pDVar12;
  DdSubtable *pDVar13;
  DdSubtable *pDVar14;
  DdSubtable *__ptr;
  DdSubtable *__ptr_00;
  unsigned_long uVar15;
  DdNode *pDVar16;
  DdNode *pDVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  DdNode **ppDVar27;
  uint uVar28;
  int index_00;
  ulong uVar29;
  size_t __size;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  size_t local_c0;
  int local_88;
  int iStack_84;
  DdSubtable *local_70;
  int local_48;
  int iStack_44;
  long lVar33;
  
  uVar22 = unique->size;
  uVar24 = (ulong)uVar22;
  uVar18 = index - uVar22;
  uVar29 = CONCAT44(0,uVar18);
  if ((int)uVar22 <= index) {
    lVar25 = (long)(int)uVar22;
    iVar9 = unique->maxSize;
    uVar23 = unique->initSlots;
    lVar10 = (long)(int)uVar23;
    if (iVar9 <= index) {
      iVar20 = index + 10;
      lVar26 = (long)iVar20;
      pDVar13 = (DdSubtable *)malloc(lVar26 * 0x38);
      if (pDVar13 == (DdSubtable *)0x0) goto LAB_007ffacf;
      pDVar14 = (DdSubtable *)malloc(lVar26 * 8);
      if (pDVar14 != (DdSubtable *)0x0) {
        __size = lVar26 << 2;
        __ptr = (DdSubtable *)malloc(__size);
        if (__ptr == (DdSubtable *)0x0) {
          free(pDVar13);
          pDVar13 = pDVar14;
        }
        else {
          __ptr_00 = (DdSubtable *)malloc(__size);
          if (__ptr_00 != (DdSubtable *)0x0) {
            if (unique->map == (int *)0x0) {
              uVar15 = unique->memused;
              lVar26 = (long)(iVar20 - iVar9);
              local_70 = (DdSubtable *)0x0;
            }
            else {
              local_70 = (DdSubtable *)malloc(__size);
              if (local_70 == (DdSubtable *)0x0) {
                free(pDVar13);
                free(pDVar14);
                free(__ptr);
                pDVar13 = __ptr_00;
                goto LAB_007ffaca;
              }
              lVar26 = (long)(iVar20 - iVar9);
              uVar15 = lVar26 * 4 + unique->memused;
            }
            unique->memused = (lVar10 * 8 + 0x48) * lVar26 + uVar15;
            if (unique->maxSizeZ < iVar20) {
              if (unique->stack != (DdNode **)0x0) {
                free(unique->stack);
              }
              ppDVar11 = (DdNode **)malloc((long)index * 8 + 0x58);
              unique->stack = ppDVar11;
              if (ppDVar11 == (DdNode **)0x0) {
                free(pDVar13);
                free(pDVar14);
                free(__ptr);
                free(__ptr_00);
                if ((local_70 == (DdSubtable *)0x0) ||
                   (pDVar13 = local_70, unique->map == (int *)0x0)) goto LAB_007ffacf;
                goto LAB_007ffaca;
              }
              *ppDVar11 = (DdNode *)0x0;
              iVar9 = unique->maxSize;
              if (unique->maxSize < unique->maxSizeZ) {
                iVar9 = unique->maxSizeZ;
              }
              unique->memused = unique->memused + (long)(iVar20 - iVar9) * 8;
            }
            if (0 < (int)uVar22) {
              pDVar5 = unique->subtables;
              piVar3 = unique->perm;
              ppDVar11 = unique->vars;
              piVar6 = unique->invperm;
              lVar26 = 0;
              lVar19 = 0;
              do {
                puVar1 = (undefined8 *)((long)&pDVar5->shift + lVar19);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pDVar13->shift + lVar19);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                *(undefined4 *)((long)&pDVar13->dead + lVar19) =
                     *(undefined4 *)((long)&pDVar5->dead + lVar19);
                *(undefined8 *)((long)&pDVar13->nodelist + lVar19) =
                     *(undefined8 *)((long)&pDVar5->nodelist + lVar19);
                puVar1 = (undefined8 *)((long)&pDVar5->bindVar + lVar19);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pDVar13->bindVar + lVar19);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                *(undefined4 *)((long)&pDVar13->varToBeGrouped + lVar19) =
                     *(undefined4 *)((long)&pDVar5->varToBeGrouped + lVar19);
                *(undefined8 *)((long)&pDVar14->nodelist + lVar26 * 2) =
                     *(undefined8 *)((long)ppDVar11 + lVar26 * 2);
                *(undefined4 *)((long)&__ptr->nodelist + lVar26) =
                     *(undefined4 *)((long)piVar3 + lVar26);
                *(undefined4 *)((long)&__ptr_00->nodelist + lVar26) =
                     *(undefined4 *)((long)piVar6 + lVar26);
                lVar19 = lVar19 + 0x38;
                lVar26 = lVar26 + 4;
              } while (uVar24 * 4 - lVar26 != 0);
            }
            lVar26 = (ulong)uVar23 - 1;
            auVar38._8_4_ = (int)lVar26;
            auVar38._0_8_ = lVar26;
            auVar38._12_4_ = (int)((ulong)lVar26 >> 0x20);
            auVar38 = auVar38 ^ _DAT_0093d220;
            lVar26 = lVar25;
            do {
              local_c0 = lVar10 << 3;
              pDVar13[lVar26].slots = uVar23;
              iVar9 = cuddComputeFloorLog2(uVar23);
              pDVar13[lVar26].shift = 0x20 - iVar9;
              pDVar13[lVar26].keys = 0;
              pDVar13[lVar26].maxKeys = uVar23 * 4;
              pDVar13[lVar26].dead = 0;
              pDVar5 = pDVar13 + lVar26;
              pDVar5->bindVar = 0;
              pDVar5->varType = CUDD_VAR_PRIMARY_INPUT;
              pDVar5->pairIndex = 0;
              pDVar5->varHandled = 0;
              pDVar13[lVar26].varToBeGrouped = CUDD_LAZY_NONE;
              *(int *)((long)&__ptr->nodelist + lVar26 * 4) = (int)lVar26;
              *(int *)((long)&__ptr_00->nodelist + lVar26 * 4) = (int)lVar26;
              ppDVar11 = (DdNode **)malloc(local_c0);
              pDVar13[lVar26].nodelist = ppDVar11;
              auVar37 = _DAT_0093d220;
              if (ppDVar11 == (DdNode **)0x0) goto LAB_007ffacf;
              local_48 = auVar38._0_4_;
              iStack_44 = auVar38._4_4_;
              if (0 < (int)uVar23) {
                lVar19 = 0;
                auVar36 = _DAT_0093d210;
                do {
                  bVar7 = local_48 < SUB164(auVar36 ^ auVar37,0);
                  iVar9 = SUB164(auVar36 ^ auVar37,4);
                  if ((bool)(~(iStack_44 < iVar9 || iVar9 == iStack_44 && bVar7) & 1)) {
                    *(DdManager **)((long)ppDVar11 + lVar19) = unique;
                  }
                  if (iStack_44 >= iVar9 && (iVar9 != iStack_44 || !bVar7)) {
                    *(DdManager **)((long)ppDVar11 + lVar19 + 8) = unique;
                  }
                  lVar33 = auVar36._8_8_;
                  auVar36._0_8_ = auVar36._0_8_ + 2;
                  auVar36._8_8_ = lVar33 + 2;
                  lVar19 = lVar19 + 0x10;
                } while ((ulong)(uVar23 + 1 >> 1) << 4 != lVar19);
              }
              lVar26 = lVar26 + 1;
            } while (index + 1 != (int)lVar26);
            piVar3 = unique->map;
            if (piVar3 != (int *)0x0) {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  *(int *)((long)&local_70->nodelist + uVar21 * 4) = piVar3[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              auVar38 = _DAT_0093d210;
              auVar32._8_4_ = uVar18;
              auVar32._0_8_ = uVar29;
              auVar32._12_4_ = 0;
              uVar21 = 0;
              auVar32 = auVar32 ^ auVar37;
              do {
                auVar35._8_4_ = (int)uVar21;
                auVar35._0_8_ = uVar21;
                auVar35._12_4_ = (int)(uVar21 >> 0x20);
                auVar36 = (auVar35 | auVar38) ^ auVar37;
                iVar9 = (int)uVar24;
                if ((bool)(~(auVar36._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar36._0_4_ ||
                            auVar32._4_4_ < auVar36._4_4_) & 1)) {
                  *(int *)((long)&local_70->nodelist + uVar21 * 4 + lVar25 * 4) = iVar9;
                }
                if ((auVar36._12_4_ != auVar32._12_4_ || auVar36._8_4_ <= auVar32._8_4_) &&
                    auVar36._12_4_ <= auVar32._12_4_) {
                  *(int *)((long)&local_70->nodelist + uVar21 * 4 + lVar25 * 4 + 4) = iVar9 + 1;
                }
                uVar21 = uVar21 + 2;
                uVar24 = (ulong)(iVar9 + 2);
              } while ((uVar29 + 2 & 0xfffffffffffffffe) != uVar21);
              free(piVar3);
              unique->map = (int *)local_70;
            }
            if (unique->subtables != (DdSubtable *)0x0) {
              free(unique->subtables);
            }
            unique->subtables = pDVar13;
            unique->maxSize = iVar20;
            if (unique->vars != (DdNode **)0x0) {
              free(unique->vars);
            }
            unique->vars = (DdNode **)pDVar14;
            if (unique->perm != (int *)0x0) {
              free(unique->perm);
            }
            unique->perm = (int *)__ptr;
            if (unique->invperm != (int *)0x0) {
              free(unique->invperm);
            }
            unique->invperm = (int *)__ptr_00;
            goto LAB_007ff0e8;
          }
          free(pDVar13);
          free(pDVar14);
          pDVar13 = __ptr;
        }
      }
LAB_007ffaca:
      free(pDVar13);
LAB_007ffacf:
      unique->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    pDVar13 = unique->subtables;
    lVar26 = (ulong)uVar23 - 1;
    auVar37._8_4_ = (int)lVar26;
    auVar37._0_8_ = lVar26;
    auVar37._12_4_ = (int)((ulong)lVar26 >> 0x20);
    auVar37 = auVar37 ^ _DAT_0093d220;
    lVar26 = lVar25;
    do {
      pDVar13[lVar26].slots = uVar23;
      iVar9 = cuddComputeFloorLog2(uVar23);
      pDVar13 = unique->subtables;
      pDVar13[lVar26].shift = 0x20 - iVar9;
      pDVar13[lVar26].keys = 0;
      pDVar13[lVar26].maxKeys = uVar23 * 4;
      pDVar13[lVar26].dead = 0;
      pDVar13[lVar26].varToBeGrouped = CUDD_LAZY_NONE;
      pDVar14 = pDVar13 + lVar26;
      pDVar14->bindVar = 0;
      pDVar14->varType = CUDD_VAR_PRIMARY_INPUT;
      pDVar14->pairIndex = 0;
      pDVar14->varHandled = 0;
      iVar9 = (int)lVar26;
      unique->perm[lVar26] = iVar9;
      unique->invperm[lVar26] = iVar9;
      ppDVar11 = (DdNode **)malloc(lVar10 << 3);
      pDVar13[lVar26].nodelist = ppDVar11;
      auVar38 = _DAT_0093d220;
      if (ppDVar11 == (DdNode **)0x0) {
        if ((int)uVar22 < iVar9) {
          lVar10 = lVar25 * 0x38;
          lVar25 = iVar9 - lVar25;
          do {
            pvVar4 = *(void **)((long)&pDVar13->nodelist + lVar10);
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
              pDVar13 = unique->subtables;
              *(undefined8 *)((long)&pDVar13->nodelist + lVar10) = 0;
            }
            lVar10 = lVar10 + 0x38;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
        goto LAB_007ffacf;
      }
      local_88 = auVar37._0_4_;
      iStack_84 = auVar37._4_4_;
      if (0 < (int)uVar23) {
        lVar19 = 0;
        auVar30 = _DAT_0093d210;
        do {
          bVar7 = local_88 < SUB164(auVar30 ^ auVar38,0);
          iVar9 = SUB164(auVar30 ^ auVar38,4);
          if ((bool)(~(iStack_84 < iVar9 || iVar9 == iStack_84 && bVar7) & 1)) {
            *(DdManager **)((long)ppDVar11 + lVar19) = unique;
          }
          if (iStack_84 >= iVar9 && (iVar9 != iStack_84 || !bVar7)) {
            *(DdManager **)((long)ppDVar11 + lVar19 + 8) = unique;
          }
          lVar33 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 2;
          auVar30._8_8_ = lVar33 + 2;
          lVar19 = lVar19 + 0x10;
        } while ((ulong)(uVar23 + 1 >> 1) << 4 != lVar19);
      }
      auVar36 = _DAT_0093d210;
      lVar26 = lVar26 + 1;
    } while (index + 1 != (int)lVar26);
    piVar3 = unique->map;
    if (piVar3 != (int *)0x0) {
      auVar31._8_4_ = uVar18;
      auVar31._0_8_ = uVar29;
      auVar31._12_4_ = 0;
      uVar21 = 0;
      auVar31 = auVar31 ^ auVar38;
      do {
        auVar34._8_4_ = (int)uVar21;
        auVar34._0_8_ = uVar21;
        auVar34._12_4_ = (int)(uVar21 >> 0x20);
        auVar37 = (auVar34 | auVar36) ^ auVar38;
        iVar9 = (int)uVar24;
        if ((bool)(~(auVar37._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar37._0_4_ ||
                    auVar31._4_4_ < auVar37._4_4_) & 1)) {
          piVar3[lVar25 + uVar21] = iVar9;
        }
        if ((auVar37._12_4_ != auVar31._12_4_ || auVar37._8_4_ <= auVar31._8_4_) &&
            auVar37._12_4_ <= auVar31._12_4_) {
          piVar3[lVar25 + uVar21 + 1] = iVar9 + 1;
        }
        uVar21 = uVar21 + 2;
        uVar24 = (ulong)(iVar9 + 2);
      } while ((uVar29 + 2 & 0xfffffffffffffffe) != uVar21);
    }
LAB_007ff0e8:
    pDVar16 = unique->one;
    uVar28 = index + 1;
    unique->size = uVar28;
    iVar9 = uVar23 * (uVar28 - uVar22);
    uVar23 = unique->slots + iVar9;
    unique->slots = uVar23;
    unique->minDead = (uint)(long)((double)uVar23 * unique->gcFrac);
    uVar18 = unique->maxCacheHard;
    if (uVar23 * 4 < unique->maxCacheHard) {
      uVar18 = uVar23 * 4;
    }
    iVar20 = uVar18 + unique->cacheSlots * -2;
    unique->cacheSlack = iVar20;
    if (-1 < iVar20 && unique->cacheSlots < uVar23 >> 1) {
      cuddCacheResize(unique);
    }
    iVar20 = unique->autoDyn;
    unique->autoDyn = 0;
    lVar10 = lVar25;
    do {
      index_00 = (int)lVar10;
      pDVar12 = cuddUniqueInter(unique,index_00,pDVar16,(DdNode *)((ulong)pDVar16 ^ 1));
      unique->vars[lVar10] = pDVar12;
      if (unique->vars[lVar10] == (DdNode *)0x0) {
        unique->autoDyn = iVar20;
        if ((int)uVar22 < index_00) {
          lVar10 = lVar25;
          do {
            Cudd_IterDerefBdd(unique,unique->vars[lVar10]);
            ppDVar11 = unique->vars;
            ppDVar11[lVar10]->next = unique->nextFree;
            unique->nextFree = ppDVar11[lVar10];
            ppDVar11[lVar10] = (DdNode *)0x0;
            lVar10 = lVar10 + 1;
          } while (index_00 != lVar10);
        }
        pDVar13 = unique->subtables;
        lVar25 = lVar25 * 0x38;
        do {
          pvVar4 = *(void **)((long)&pDVar13->nodelist + lVar25);
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
            pDVar13 = unique->subtables;
            *(undefined8 *)((long)&pDVar13->nodelist + lVar25) = 0;
          }
          *(undefined8 *)((long)&pDVar13->nodelist + lVar25) = 0;
          lVar25 = lVar25 + 0x38;
          uVar28 = uVar28 - 1;
        } while (uVar22 != uVar28);
        unique->size = uVar22;
        uVar18 = unique->slots - iVar9;
        unique->slots = uVar18;
        unique->minDead = (uint)(long)((double)uVar18 * unique->gcFrac);
        uVar22 = unique->maxCacheHard;
        if (uVar18 * 4 < unique->maxCacheHard) {
          uVar22 = uVar18 * 4;
        }
        iVar9 = uVar22 + unique->cacheSlots * -2;
        unique->cacheSlack = iVar9;
        if (iVar9 < 0 || uVar18 >> 1 <= unique->cacheSlots) {
          return (DdNode *)0x0;
        }
        cuddCacheResize(unique);
        return (DdNode *)0x0;
      }
      piVar3 = (int *)(((ulong)unique->vars[lVar10] & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + 1;
      lVar10 = lVar10 + 1;
    } while (uVar28 != (uint)lVar10);
    unique->autoDyn = iVar20;
  }
  pDVar14 = unique->subtables;
  uVar22 = unique->perm[index];
  pDVar13 = pDVar14 + uVar22;
  uVar29 = (ulong)T & 0xfffffffffffffffe;
  uVar18 = (uint)T & 1;
  uVar24 = (ulong)E & 0xfffffffffffffffe;
  uVar23 = (uint)E & 1;
  ppDVar11 = pDVar14[uVar22].nodelist +
             (int)((uVar23 + *(int *)(uVar24 + 0x20) * 2 +
                   (uVar18 + *(int *)(uVar29 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                  ((byte)pDVar14[uVar22].shift & 0x1f));
  do {
    ppDVar27 = ppDVar11;
    pDVar16 = *ppDVar27;
    pDVar12 = (pDVar16->type).kids.T;
    ppDVar11 = &pDVar16->next;
  } while (T < pDVar12);
  if (pDVar12 == T) {
    pDVar12 = (pDVar16->type).kids.E;
    if (E < pDVar12) {
      do {
        pDVar17 = pDVar16;
        pDVar16 = pDVar17->next;
        if ((pDVar16->type).kids.T != T) {
          ppDVar27 = &pDVar17->next;
          goto LAB_007ff40e;
        }
        pDVar12 = (pDVar16->type).kids.E;
      } while (E < pDVar12);
      ppDVar27 = &pDVar17->next;
    }
    if (pDVar12 == E) {
      if (pDVar16->ref == 0) {
        cuddReclaim(unique,pDVar16);
        return pDVar16;
      }
      return pDVar16;
    }
  }
LAB_007ff40e:
  if ((unique->autoDyn != 0) &&
     (unique->nextDyn <= unique->keys - (unique->countDead & unique->dead))) {
    iVar9 = Cudd_ReduceHeap(unique,unique->autoMethod,10);
    if (iVar9 != 0) {
      return (DdNode *)0x0;
    }
    unique->reordered = 2;
    return (DdNode *)0x0;
  }
  if (pDVar13->keys <= pDVar13->maxKeys) goto LAB_007ff540;
  if (unique->gcEnabled == 0) {
LAB_007ff4c6:
    cuddRehash(unique,uVar22);
  }
  else {
    if ((unique->dead <= unique->minDead) &&
       ((unique->dead <= unique->minDead >> 1 ||
        ((double)pDVar13->dead <= (double)pDVar13->keys * 0.95)))) goto LAB_007ff4c6;
    cuddGarbageCollect(unique,1);
  }
  ppDVar11 = pDVar13->nodelist +
             (int)((uVar23 + *(int *)(uVar24 + 0x20) * 2 +
                   (uVar18 + *(int *)(uVar29 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                  ((byte)pDVar13->shift & 0x1f));
  do {
    ppDVar27 = ppDVar11;
    pDVar16 = *ppDVar27;
    pDVar12 = (pDVar16->type).kids.T;
    ppDVar11 = &pDVar16->next;
  } while (T < pDVar12);
  if ((pDVar12 == T) && (E < (pDVar16->type).kids.E)) {
    do {
      pDVar12 = pDVar16;
      pDVar16 = pDVar12->next;
      if ((pDVar16->type).kids.T != T) break;
    } while (E < (pDVar16->type).kids.E);
    ppDVar27 = &pDVar12->next;
  }
LAB_007ff540:
  iVar9 = unique->garbageCollections;
  pDVar16 = cuddAllocNode(unique);
  if (pDVar16 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  unique->keys = unique->keys + 1;
  pDVar13->keys = pDVar13->keys + 1;
  if (iVar9 != unique->garbageCollections) {
    ppDVar11 = pDVar13->nodelist +
               (int)((uVar23 + *(int *)(uVar24 + 0x20) * 2 +
                     (uVar18 + *(int *)(uVar29 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                    ((byte)pDVar13->shift & 0x1f));
    do {
      ppDVar27 = ppDVar11;
      pDVar12 = *ppDVar27;
      pDVar17 = (pDVar12->type).kids.T;
      ppDVar11 = &pDVar12->next;
    } while (T < pDVar17);
    if ((pDVar17 == T) && (E < (pDVar12->type).kids.E)) {
      do {
        pDVar17 = pDVar12;
        pDVar12 = pDVar17->next;
        if ((pDVar12->type).kids.T != T) break;
      } while (E < (pDVar12->type).kids.E);
      ppDVar27 = &pDVar17->next;
    }
  }
  pDVar16->index = index;
  (pDVar16->type).kids.T = T;
  (pDVar16->type).kids.E = E;
  pDVar16->next = *ppDVar27;
  *ppDVar27 = pDVar16;
  T->ref = T->ref + 1;
  *(int *)(uVar24 + 4) = *(int *)(uVar24 + 4) + 1;
  return pDVar16;
}

Assistant:

DdNode *
cuddUniqueInter(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdNodePtr *previousP;
    DdSubtable *subtable;
    int gcNumber;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->size) {
        if (!ddResizeTable(unique,index)) return(NULL);
    }

    level = unique->perm[index];
    subtable = &(unique->subtables[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddI(unique,T->index));
    assert(level < (unsigned) cuddI(unique,Cudd_Regular(E)->index));
#endif

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    previousP = &(nodelist[pos]);
    looking = *previousP;

    while (T < cuddT(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    while (T == cuddT(looking) && E < cuddE(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    if (T == cuddT(looking) && E == cuddE(looking)) {
        if (looking->ref == 0) {
            cuddReclaim(unique,looking);
        }
        return(looking);
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDyn &&
    unique->keys - (unique->dead & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_ReduceHeap(unique,unique->autoMethod,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled &&
            ((unique->dead > unique->minDead) ||
            ((unique->dead > unique->minDead / 2) &&
            (subtable->dead > subtable->keys * 0.95)))) { /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,(int)level);
        }
        /* Update pointer to insertion point. In the case of rehashing,
        ** the slot may have changed. In the case of garbage collection,
        ** the predecessor may have been dead. */
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking = *previousP;

        while (T < cuddT(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking) && E < cuddE(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }

    gcNumber = unique->garbageCollections;
    looking = cuddAllocNode(unique);
    if (looking == NULL) {
        return(NULL);
    }
    unique->keys++;
    subtable->keys++;

    if (gcNumber != unique->garbageCollections) {
        DdNode *looking2;
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking2 = *previousP;

        while (T < cuddT(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking2) && E < cuddE(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = *previousP;
    *previousP = looking;
    cuddSatInc(T->ref);         /* we know T is a regular pointer */
    cuddRef(E);

#ifdef DD_DEBUG
    cuddCheckCollisionOrdering(unique,level,pos);
#endif

//    assert( Cudd_Regular(T)->Id < 100000000 );
//    assert( Cudd_Regular(E)->Id < 100000000 );
    return(looking);

}